

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

double __thiscall phyr::Sphere::solidAngle(Sphere *this,Point3f *p,int nSamples)

{
  Transform *pTVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  pTVar1 = (this->super_Shape).localToWorld;
  dVar6 = (pTVar1->mat).d[0][2] * 0.0 + (pTVar1->mat).d[0][0] * 0.0 + (pTVar1->mat).d[0][1] * 0.0 +
          (pTVar1->mat).d[0][3];
  dVar7 = (pTVar1->mat).d[1][2] * 0.0 + (pTVar1->mat).d[1][0] * 0.0 + (pTVar1->mat).d[1][1] * 0.0 +
          (pTVar1->mat).d[1][3];
  dVar4 = (pTVar1->mat).d[3][2] * 0.0 + (pTVar1->mat).d[3][0] * 0.0 + (pTVar1->mat).d[3][1] * 0.0 +
          (pTVar1->mat).d[3][3];
  bVar2 = NAN(dVar4);
  bVar3 = dVar4 == 1.0;
  dVar4 = 1.0 / dVar4;
  dVar5 = dVar6 * dVar4;
  if ((bVar3) && (!bVar2)) {
    dVar5 = dVar6;
  }
  dVar8 = (pTVar1->mat).d[2][2] * 0.0 + (pTVar1->mat).d[2][0] * 0.0 + (pTVar1->mat).d[2][1] * 0.0 +
          (pTVar1->mat).d[2][3];
  dVar6 = dVar7 * dVar4;
  if ((bVar3) && (!bVar2)) {
    dVar6 = dVar7;
  }
  dVar4 = dVar4 * dVar8;
  if ((bVar3) && (!bVar2)) {
    dVar4 = dVar8;
  }
  dVar5 = p->x - dVar5;
  dVar6 = p->y - dVar6;
  dVar4 = p->z - dVar4;
  dVar5 = dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6;
  dVar4 = this->radius * this->radius;
  if (dVar4 < dVar5) {
    dVar5 = 1.0 - dVar4 / dVar5;
    if (dVar5 <= 0.0) {
      dVar5 = 0.0;
    }
    return (1.0 - SQRT(dVar5)) * 6.283185307179586;
  }
  return 12.566370614359172;
}

Assistant:

Real Sphere::solidAngle(const Point3f& p, int nSamples) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));
    if (distanceSquared(p, pCenter) <= radius * radius) return 4 * Pi;

    Real sinTheta2 = radius * radius / distanceSquared(p, pCenter);
    Real cosTheta = std::sqrt(std::max((Real)0, 1 - sinTheta2));
    return (2 * Pi * (1 - cosTheta));
}